

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O2

void __thiscall FTexture::CopySize(FTexture *this,FTexture *BaseTexture)

{
  byte bVar1;
  double dVar2;
  WORD WVar3;
  SWORD SVar4;
  
  WVar3 = BaseTexture->Height;
  this->Width = BaseTexture->Width;
  this->Height = WVar3;
  SVar4 = BaseTexture->TopOffset;
  this->LeftOffset = BaseTexture->LeftOffset;
  this->TopOffset = SVar4;
  bVar1 = BaseTexture->WidthBits;
  this->WidthBits = bVar1;
  this->HeightBits = BaseTexture->HeightBits;
  dVar2 = (BaseTexture->Scale).Y;
  (this->Scale).X = (BaseTexture->Scale).X;
  (this->Scale).Y = dVar2;
  this->WidthMask = ~(ushort)(-1 << (bVar1 & 0x1f));
  return;
}

Assistant:

int GetWidth () { return Width; }